

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O2

UChar32 __thiscall icu_63::BytesDictionaryMatcher::transform(BytesDictionaryMatcher *this,UChar32 c)

{
  if ((this->transformConstant & 0x7f000000U) == 0x1000000) {
    if (c == 0x200d) {
      return 0xff;
    }
    if (c == 0x200c) {
      return 0xfe;
    }
    c = c - (this->transformConstant & 0x1fffffU);
    if (0xfd < (uint)c) {
      c = 0xffffffff;
    }
  }
  return c;
}

Assistant:

UChar32 BytesDictionaryMatcher::transform(UChar32 c) const {
    if ((transformConstant & DictionaryData::TRANSFORM_TYPE_MASK) == DictionaryData::TRANSFORM_TYPE_OFFSET) {
        if (c == 0x200D) {
            return 0xFF;
        } else if (c == 0x200C) {
            return 0xFE;
        }
        int32_t delta = c - (transformConstant & DictionaryData::TRANSFORM_OFFSET_MASK);
        if (delta < 0 || 0xFD < delta) {
            return U_SENTINEL;
        }
        return (UChar32)delta;
    }
    return c;
}